

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_algebra.cxx
# Opt level: O1

void __thiscall HAXX_ALGEBRA::conj::test_method(conj *this)

{
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined1 *local_1c8;
  undefined8 *local_1c0;
  undefined **local_1b8;
  undefined1 local_1b0;
  undefined8 *local_1a8;
  undefined1 **local_1a0;
  undefined **local_198;
  undefined1 local_190;
  undefined8 *local_188;
  undefined8 **local_180;
  undefined1 local_178 [8];
  undefined8 local_170;
  shared_count sStack_168;
  char *local_160;
  char *local_158;
  undefined **local_150;
  undefined1 local_148;
  undefined8 *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x14);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00151bb0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1c0 = &local_1d0;
  local_1d0 = 0x3ff0000000000000;
  local_1d8 = 0x3ff0000000000000;
  local_178[0] = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_158 = "";
  local_180 = &local_1c0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00151bf0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = 0;
  local_1a0 = &local_1c8;
  local_1b8 = &PTR__lazy_ostream_00151bf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = (undefined1 *)&local_1d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x15);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00151bb0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1d0 = 0xc000000000000000;
  local_1d8 = 0xc000000000000000;
  local_178[0] = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_158 = "";
  local_1c0 = &local_1d0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00151bf0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1c0;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00151bf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_1c8 = (undefined1 *)&local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (local_178,&local_150,&local_160,0x15,1,2,2,"p.imag_i()",&local_198,"-q.imag_i()",
             &local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x16);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00151bb0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1d0 = 0xc008000000000000;
  local_1d8 = 0xc008000000000000;
  local_178[0] = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_158 = "";
  local_1c0 = &local_1d0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00151bf0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1c0;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00151bf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_1c8 = (undefined1 *)&local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (local_178,&local_150,&local_160,0x16,1,2,2,"p.imag_j()",&local_198,"-q.imag_j()",
             &local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x17);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00151bb0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1d0 = 0xc010000000000000;
  local_1d8 = 0xc010000000000000;
  local_178[0] = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_158 = "";
  local_1c0 = &local_1d0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00151bf0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1c0;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00151bf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_1c8 = (undefined1 *)&local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (local_178,&local_150,&local_160,0x17,1,2,2,"p.imag_k()",&local_198,"-q.imag_k()",
             &local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x19);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00151bb0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1d0 = 0x3ff0000000000000;
  local_1d8 = 0x3ff0000000000000;
  local_178[0] = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_158 = "";
  local_1c0 = &local_1d0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00151bf0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1c0;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00151bf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_1c8 = (undefined1 *)&local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (local_178,&local_150,&local_160,0x19,1,2,2,"q.real()",&local_198,"1.",&local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x1a);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00151bb0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1d0 = 0x4000000000000000;
  local_1d8 = 0x4000000000000000;
  local_178[0] = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_158 = "";
  local_1c0 = &local_1d0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00151bf0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1c0;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00151bf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_1c8 = (undefined1 *)&local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (local_178,&local_150,&local_160,0x1a,1,2,2,"q.imag_i()",&local_198,"2.",&local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1b);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00151bb0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1d0 = 0x4008000000000000;
  local_1d8 = 0x4008000000000000;
  local_178[0] = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_158 = "";
  local_1c0 = &local_1d0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00151bf0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1c0;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00151bf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_1c8 = (undefined1 *)&local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (local_178,&local_150,&local_160,0x1b,1,2,2,"q.imag_j()",&local_198,"3.",&local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x1c);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00151bb0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1d0 = 0x4010000000000000;
  local_1d8 = 0x4010000000000000;
  local_178[0] = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_algebra.cxx";
  local_158 = "";
  local_1c0 = &local_1d0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00151bf0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1c0;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00151bf0;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_1c8 = (undefined1 *)&local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (local_178,&local_150,&local_160,0x1c,1,2,2,"q.imag_k()",&local_198,"4.",&local_1b8);
  boost::detail::shared_count::~shared_count(&sStack_168);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(conj)
{
  HAXX::quaternion<double> q(1.,2.,3.,4.);
  HAXX::quaternion<double> p = HAXX::conj(q);

  
  BOOST_CHECK_EQUAL(p.real(),  q.real()   );
  BOOST_CHECK_EQUAL(p.imag_i(),-q.imag_i());
  BOOST_CHECK_EQUAL(p.imag_j(),-q.imag_j());
  BOOST_CHECK_EQUAL(p.imag_k(),-q.imag_k());

  BOOST_CHECK_EQUAL(q.real(),  1.);
  BOOST_CHECK_EQUAL(q.imag_i(),2.);
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);
}